

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::IfGenerateSyntax::IfGenerateSyntax
          (IfGenerateSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          Token keyword,Token openParen,ExpressionSyntax *condition,Token closeParen,
          MemberSyntax *block,ElseClauseSyntax *elseClause)

{
  Token TVar1;
  ExpressionSyntax *pEVar2;
  MemberSyntax *pMVar3;
  MemberSyntax *local_48;
  ExpressionSyntax *local_40;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_38;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  IfGenerateSyntax *this_local;
  Token openParen_local;
  Token keyword_local;
  
  TVar1 = closeParen;
  openParen_local._0_8_ = openParen.info;
  this_local = openParen._0_8_;
  openParen_local.info = keyword._0_8_;
  local_38 = attributes;
  attributes_local = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,IfGenerate,attributes);
  *(Info **)&this->keyword = openParen_local.info;
  (this->keyword).info = keyword.info;
  *(IfGenerateSyntax **)&this->openParen = this_local;
  (this->openParen).info = (Info *)openParen_local._0_8_;
  local_40 = condition;
  not_null<slang::syntax::ExpressionSyntax*>::not_null<slang::syntax::ExpressionSyntax*,void>
            ((not_null<slang::syntax::ExpressionSyntax*> *)&this->condition,&local_40);
  (this->closeParen).kind = closeParen.kind;
  (this->closeParen).field_0x2 = closeParen._2_1_;
  (this->closeParen).numFlags = (NumericTokenFlags)closeParen.numFlags.raw;
  (this->closeParen).rawLen = closeParen.rawLen;
  closeParen.info = TVar1.info;
  (this->closeParen).info = closeParen.info;
  local_48 = block;
  not_null<slang::syntax::MemberSyntax*>::not_null<slang::syntax::MemberSyntax*,void>
            ((not_null<slang::syntax::MemberSyntax*> *)&this->block,&local_48);
  this->elseClause = elseClause;
  pEVar2 = not_null<slang::syntax::ExpressionSyntax_*>::operator->(&this->condition);
  (pEVar2->super_SyntaxNode).parent = (SyntaxNode *)this;
  pMVar3 = not_null<slang::syntax::MemberSyntax_*>::operator->(&this->block);
  (pMVar3->super_SyntaxNode).parent = (SyntaxNode *)this;
  if (this->elseClause != (ElseClauseSyntax *)0x0) {
    (this->elseClause->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

IfGenerateSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, Token openParen, ExpressionSyntax& condition, Token closeParen, MemberSyntax& block, ElseClauseSyntax* elseClause) :
        MemberSyntax(SyntaxKind::IfGenerate, attributes), keyword(keyword), openParen(openParen), condition(&condition), closeParen(closeParen), block(&block), elseClause(elseClause) {
        this->condition->parent = this;
        this->block->parent = this;
        if (this->elseClause) this->elseClause->parent = this;
    }